

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket_skew.cpp
# Opt level: O3

void compute_skew<4u>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *name)

{
  int *piVar1;
  double dVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int *__s;
  pointer puVar9;
  pointer pvVar10;
  ostream *poVar11;
  uint *puVar12;
  pointer puVar13;
  pointer pdVar14;
  uint *puVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  size_t i;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [56];
  undefined1 auVar26 [64];
  undefined1 in_XMM3 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_sizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_usage;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_max;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_min;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real_dists;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  allocator_type local_d1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_98;
  double local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  string *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_98 = input;
  local_50 = name;
  __s = (int *)operator_new(0x20000000);
  uVar22 = 0;
  memset(__s,0,0x20000000);
  do {
    iVar8 = 0;
    if (uVar22 < 0x800) {
      iVar18 = (int)uVar22;
      iVar8 = 0;
    }
    else {
      uVar23 = uVar22 & 0xffffffff;
      do {
        iVar18 = (int)(uVar23 >> 8);
        iVar8 = iVar8 + 0x7f8;
        uVar21 = (uint)uVar23;
        uVar23 = uVar23 >> 8;
      } while (0x7ffff < uVar21);
    }
    __s[uVar22] = iVar8 + iVar18;
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0x8000000);
  iVar8 = *__s;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_88,(iterator)0x0,(uint *)&local_d0);
  uVar21 = 1;
  lVar16 = 0;
  do {
    iVar18 = __s[lVar16 + 1];
    if (iVar18 != iVar8) {
      uVar20 = (uint)lVar16;
      if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = uVar20;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_b8,
                   (iterator)
                   local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_d0);
      }
      else {
        *local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar20;
        local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = uVar20 + 1;
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_d0);
      }
      else {
        *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (uint)local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = uVar21;
      if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_d0);
      }
      else {
        *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar21;
        local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar21 = 0;
    }
    uVar21 = uVar21 + 1;
    lVar16 = lVar16 + 1;
    iVar8 = iVar18;
  } while (lVar16 != 0x7ffffff);
  if (uVar21 != 0) {
    local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7ffffff;
    if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_b8,
                 (iterator)
                 local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_d0);
    }
    else {
      *local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x7ffffff;
      local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar21;
    if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_d0);
    }
    else {
      *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar21;
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_d0,
             (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_68);
  puVar9 = (local_98->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar16 = (long)(local_98->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)puVar9;
  if (lVar16 != 0) {
    lVar16 = lVar16 >> 2;
    lVar17 = 0;
    do {
      uVar21 = puVar9[lVar17];
      iVar18 = 0;
      uVar20 = uVar21;
      iVar8 = 0;
      if (0x7ff < uVar21) {
        do {
          uVar20 = uVar21 >> 8;
          iVar18 = iVar18 + 0x7f8;
          bVar4 = 0x7ffff < uVar21;
          uVar21 = uVar20;
          iVar8 = iVar18;
        } while (bVar4);
      }
      lVar17 = lVar17 + 1;
      piVar1 = (int *)(CONCAT44(local_d0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint)local_d0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) +
                      (ulong)(iVar8 + uVar20) * 4);
      *piVar1 = *piVar1 + 1;
    } while (lVar17 != lVar16 + (ulong)(lVar16 == 0));
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_68,
           (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2,&local_d1);
  puVar9 = (local_98->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar13 = (local_98->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar13 != puVar9) {
    uVar22 = 0;
    do {
      uVar21 = puVar9[uVar22];
      iVar8 = 0;
      uVar20 = uVar21;
      if (0x7ff < uVar21) {
        iVar8 = 0;
        uVar19 = uVar21;
        do {
          uVar20 = uVar19 >> 8;
          iVar8 = iVar8 + 0x7f8;
          bVar4 = 0x7ffff < uVar19;
          uVar19 = uVar20;
        } while (bVar4);
      }
      uVar20 = iVar8 + uVar20;
      pdVar14 = local_68.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar20].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (local_68.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar20].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish == pdVar14) {
        std::vector<double,_std::allocator<double>_>::resize
                  (local_68.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar20,
                   (ulong)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar20]);
        puVar9 = (local_98->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        puVar13 = (local_98->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        pdVar14 = local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar20].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar21 = puVar9[uVar22];
      }
      uVar22 = uVar22 + 1;
      pdVar14[uVar21 - local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar20]] =
           pdVar14[uVar21 - local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar20]] + 1.0;
    } while (uVar22 < (ulong)((long)puVar13 - (long)puVar9 >> 2));
  }
  if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar22 = 0;
    puVar12 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar15 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      if (*(int *)(CONCAT44(local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_d0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) + uVar22 * 4) != 0) {
        auVar25 = vcvtusi2sd_avx512f(in_XMM3,puVar12[uVar22]);
        auVar26 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        local_48 = log2(1.0 / auVar25._0_8_);
        auVar25 = auVar26._0_16_;
        pdVar14 = local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar22].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uStack_40 = extraout_XMM0_Qb;
        if (local_68.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar22].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish == pdVar14) {
          local_90 = 0.0;
        }
        else {
          uVar23 = 0;
          local_90 = 0.0;
          pvVar10 = local_68.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            dVar2 = pdVar14[uVar23];
            if ((dVar2 != 0.0) || (NAN(dVar2))) {
              auVar25 = vcvtusi2sd_avx512f(in_XMM3,*(undefined4 *)
                                                    (CONCAT44(local_d0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)local_d0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                                  uVar22 * 4));
              auVar26._0_8_ = log2(dVar2 / auVar25._0_8_);
              auVar26._8_56_ = extraout_var;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = local_90;
              pdVar14 = local_68.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar22].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              auVar25._8_8_ = 0;
              auVar25._0_8_ = pdVar14[uVar23];
              auVar25 = vfnmadd231sd_fma(auVar24,auVar26._0_16_,auVar25);
              auVar26 = ZEXT1664(auVar25);
              local_90 = auVar25._0_8_;
              pvVar10 = local_68.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            auVar25 = auVar26._0_16_;
            uVar23 = uVar23 + 1;
          } while (uVar23 < (ulong)((long)pvVar10[uVar22].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar14
                                   >> 3));
        }
        uVar3 = *(undefined4 *)
                 (CONCAT44(local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           (uint)local_d0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) + uVar22 * 4);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(local_50->_M_dataplus)._M_p,
                             local_50->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        auVar7._8_8_ = uStack_40;
        auVar7._0_8_ = local_48;
        auVar5._8_8_ = 0x8000000000000000;
        auVar5._0_8_ = 0x8000000000000000;
        auVar24 = vxorpd_avx512vl(auVar7,auVar5);
        auVar25 = vcvtusi2sd_avx512f(auVar25,uVar3);
        poVar11 = std::ostream::_M_insert<double>(auVar24._0_8_ - local_90 / auVar25._0_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        puVar12 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar15 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (ulong)((long)puVar15 - (long)puVar12 >> 2));
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_68);
  pvVar6 = (void *)CONCAT44(local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_d0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_d0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(__s,0x20000000);
  return;
}

Assistant:

void compute_skew(std::vector<uint32_t>& input, std::string name)
{
    std::vector<uint32_t> bucket_map(1 << 27);
    for (size_t i = 0; i < bucket_map.size(); i++) {
        bucket_map[i] = compute_bucket<fidelity>(i);
    }
    std::vector<uint32_t> bucket_sizes;
    std::vector<uint32_t> bucket_min;
    std::vector<uint32_t> bucket_max;
    uint32_t prev = bucket_map[0];
    bucket_min.push_back(0);
    auto cur_size = 1;
    for (size_t i = 1; i < bucket_map.size(); i++) {
        auto cur = bucket_map[i];
        if (cur != prev) {
            bucket_max.push_back(i - 1);
            bucket_min.push_back(i);
            bucket_sizes.push_back(cur_size);
            cur_size = 0;
        }
        cur_size++;
        prev = cur;
    }
    if (cur_size) {
        bucket_max.push_back(bucket_map.size() - 1);
        bucket_sizes.push_back(cur_size);
    }

    std::vector<uint32_t> bucket_usage(bucket_sizes.size());
    for (size_t i = 0; i < input.size(); i++) {
        auto bucket_id = compute_bucket<fidelity>(input[i]);
        bucket_usage[bucket_id]++;
    }

    std::vector<std::vector<double>> real_dists(bucket_sizes.size());
    for (size_t i = 0; i < input.size(); i++) {
        auto bucket_id = compute_bucket<fidelity>(input[i]);
        if (real_dists[bucket_id].size() == 0)
            real_dists[bucket_id].resize(bucket_sizes[bucket_id]);
        auto bucket_offset = input[i] - bucket_min[bucket_id];
        real_dists[bucket_id][bucket_offset] += 1.0;
    }
    size_t usage_cum_sum = 0;
    for (size_t i = 0; i < bucket_sizes.size(); i++) {
        if (bucket_usage[i] != 0) {
            double bits_uniform = -log2(double(1.0) / double(bucket_sizes[i]));
            double bits_real = 0.0;
            for (size_t j = 0; j < real_dists[i].size(); j++) {
                if (real_dists[i][j] != 0.0) {
                    double bits
                        = -log2(real_dists[i][j] / double(bucket_usage[i]));
                    bits_real += real_dists[i][j] * bits;
                }
            }
            bits_real /= double(bucket_usage[i]);
            usage_cum_sum += bucket_usage[i];
            std::cout << name << ";" << i << ";" << fidelity << ";"
                      << bucket_min[i] << ";" << bucket_max[i] << ";"
                      << bucket_sizes[i] << ";" << bucket_usage[i] << ";"
                      << usage_cum_sum << ";" << input.size() << ";"
                      << (bits_uniform - bits_real) << std::endl;
        }
    }
}